

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmValue cmTargetPropertyComputer::GetSources<cmTarget>(cmTarget *tgt,cmMakefile *mf)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer pBVar2;
  pointer pbVar3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  size_type sVar7;
  cmSourceFile *this;
  cmSourceFileLocation *pcVar8;
  ostream *poVar9;
  PolicyID id;
  string *psVar10;
  char *pcVar11;
  pointer input;
  pointer pBVar12;
  string_view arg;
  string_view str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_360;
  string objLibName;
  ostringstream e;
  long local_318;
  ostringstream ss;
  
  _Var1._M_head_impl =
       (tgt->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pBVar12 = *(pointer *)
             &((_Var1._M_head_impl)->SourceEntries).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  pBVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->SourceEntries + 8);
  if (pBVar12 == pBVar2) {
    psVar10 = (string *)0x0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    pcVar11 = "";
    for (; pBVar12 != pBVar2; pBVar12 = pBVar12 + 1) {
      arg._M_str = *(char **)&pBVar12->Value;
      arg._M_len = *(size_type *)((long)&pBVar12->Value + 8);
      cmExpandedList_abi_cxx11_(&files,arg,false);
      pbVar3 = files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (input = files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; input != pbVar3; input = input + 1) {
        str._M_str = (input->_M_dataplus)._M_p;
        str._M_len = input->_M_string_length;
        bVar4 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])"$<TARGET_OBJECTS:");
        if ((bVar4) && ((input->_M_dataplus)._M_p[input->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&objLibName,(ulong)input);
          sVar7 = cmGeneratorExpression::Find(&objLibName);
          if (sVar7 == 0xffffffffffffffff) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            PVar5 = cmMakefile::GetPolicyStatus(mf,CMP0051,false);
            if (PVar5 - NEW < 3) {
              std::operator<<((ostream *)&ss,pcVar11);
              std::operator<<((ostream *)&ss,(string *)input);
              pcVar11 = ";";
            }
            else if (PVar5 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_360,(cmPolicies *)0x33,id);
              poVar9 = std::operator<<((ostream *)&e,(string *)&local_360);
              std::operator<<(poVar9,"\n");
              std::__cxx11::string::~string((string *)&local_360);
              poVar9 = std::operator<<((ostream *)&e,"Target \"");
              poVar9 = std::operator<<(poVar9,(string *)
                                              &((tgt->impl)._M_t.
                                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                               _M_head_impl)->Name);
              std::operator<<(poVar9,
                              "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                             );
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_360);
              std::__cxx11::string::~string((string *)&local_360);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
          else {
            std::operator<<((ostream *)&ss,pcVar11);
            std::operator<<((ostream *)&ss,(string *)input);
            pcVar11 = ";";
          }
          std::__cxx11::string::~string((string *)&objLibName);
        }
        else {
          sVar7 = cmGeneratorExpression::Find(input);
          if (sVar7 == 0xffffffffffffffff) {
            std::operator<<((ostream *)&ss,pcVar11);
            std::operator<<((ostream *)&ss,(string *)input);
            pcVar11 = ";";
          }
          else {
            this = cmMakefile::GetOrCreateSource
                             (((tgt->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              Makefile,input,false,Ambiguous);
            pcVar8 = cmSourceFile::GetLocation(this);
            std::__cxx11::string::string((string *)&e,(string *)&pcVar8->Directory);
            if (local_318 != 0) {
              std::__cxx11::string::append((char *)&e);
            }
            std::__cxx11::string::append((string *)&e);
            std::operator<<((ostream *)&ss,pcVar11);
            std::operator<<((ostream *)&ss,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            pcVar11 = ";";
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&files);
    }
    if (GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_ == '\0') {
      iVar6 = __cxa_guard_acquire(&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::
                                   srcs_abi_cxx11_);
      if (iVar6 != 0) {
        GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_.
                       field_2;
        GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_._M_string_length =
             0;
        GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_.field_2.
        _M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::
                             srcs_abi_cxx11_);
      }
    }
    std::__cxx11::stringbuf::str();
    psVar10 = &GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_;
    std::__cxx11::string::operator=
              ((string *)&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_,
               (string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  return (cmValue)psVar10;
}

Assistant:

cmValue cmTargetPropertyComputer::GetSources<cmTarget>(cmTarget const* tgt,
                                                       cmMakefile const& mf)
{
  cmBTStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return nullptr;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (auto const& entry : entries) {
    std::vector<std::string> files = cmExpandedList(entry.Value);
    for (std::string const& file : files) {
      if (cmHasLiteralPrefix(file, "$<TARGET_OBJECTS:") &&
          file.back() == '>') {
        std::string objLibName = file.substr(17, file.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << file;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        MessageType messageType = MessageType::AUTHOR_WARNING;
        switch (mf.GetPolicyStatus(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
            CM_FALLTHROUGH;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
            break;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains $<TARGET_OBJECTS> generator expression in its "
               "sources list.  This content was not previously part of the "
               "SOURCES property when that property was read at configure "
               "time.  Code reading that property needs to be adapted to "
               "ignore the generator expression using the string(GENEX_STRIP) "
               "command.";
          mf.IssueMessage(messageType, e.str());
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << file;
        }
      } else if (cmGeneratorExpression::Find(file) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << file;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(file);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return cmValue(srcs);
}